

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::
get<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
          (Attribute *this,double t,
          vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_> v;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> local_58;
  optional<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  local_40;
  
  if (dst == (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     (((this->_var)._blocked != false ||
      (((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
       ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))))) {
    primvar::PrimVar::
    get_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
              (&local_40,&this->_var);
    if (local_40.has_value_ == true) {
      local_58.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_40.contained.data._0_8_;
      local_58.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_40.contained._8_8_;
      local_58.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_40.contained._16_8_;
      local_40.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_40.contained._8_8_ = 0;
      local_40.contained._16_8_ = 0;
      std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::operator=
                (dst,&local_58);
      if ((anon_struct_8_0_00000001_for___align)
          local_58.
          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
          _M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0) {
        operator_delete(local_58.
                        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_40.has_value_ != false) {
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::
            get_interpolated_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }